

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::Benchmark::Benchmark(Benchmark *this,char *name)

{
  char *pcVar1;
  void *pvVar2;
  char *in_RDI;
  BenchmarkImp *unaff_retaddr;
  
  *(undefined ***)in_RDI = &PTR__Benchmark_001cb7e8;
  pcVar1 = in_RDI + 8;
  pvVar2 = operator_new(0x80);
  BenchmarkImp::BenchmarkImp(unaff_retaddr,in_RDI);
  *(void **)pcVar1 = pvVar2;
  return;
}

Assistant:

Benchmark::Benchmark(const char* name)
    : imp_(new BenchmarkImp(name))
{
}